

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.h
# Opt level: O2

int __thiscall Consensus::Params::DeploymentHeight(Params *this,BuriedDeployment dep)

{
  int iVar1;
  undefined6 in_register_00000032;
  long in_FS_OFFSET;
  
  switch((int)CONCAT62(in_register_00000032,dep)) {
  case -0x8000:
    iVar1 = this->BIP34Height;
    break;
  case -0x7fff:
    iVar1 = this->BIP65Height;
    break;
  case -0x7ffe:
    iVar1 = this->BIP66Height;
    break;
  case -0x7ffd:
    iVar1 = this->CSVHeight;
    break;
  case -0x7ffc:
    iVar1 = this->SegwitHeight;
    break;
  default:
    iVar1 = 0x7fffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

int DeploymentHeight(BuriedDeployment dep) const
    {
        switch (dep) {
        case DEPLOYMENT_HEIGHTINCB:
            return BIP34Height;
        case DEPLOYMENT_CLTV:
            return BIP65Height;
        case DEPLOYMENT_DERSIG:
            return BIP66Height;
        case DEPLOYMENT_CSV:
            return CSVHeight;
        case DEPLOYMENT_SEGWIT:
            return SegwitHeight;
        } // no default case, so the compiler can warn about missing cases
        return std::numeric_limits<int>::max();
    }